

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::
SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::grow(SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       *this,size_t MinSize)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  void *pvVar2;
  bool bVar3;
  size_t sVar4;
  unsigned_long *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *NewElts;
  uint64_t local_58;
  size_t NewCapacity;
  size_t MinSize_local;
  SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *this_local;
  SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *local_38;
  SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *local_30;
  SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *local_28;
  SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *local_20;
  SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *local_18;
  SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *local_10;
  
  NewCapacity = MinSize;
  MinSize_local = (size_t)this;
  if (0xffffffff < MinSize) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  sVar4 = SmallVectorBase::capacity((SmallVectorBase *)this);
  local_58 = NextPowerOf2(sVar4 + 2);
  puVar5 = std::max<unsigned_long>(&local_58,&NewCapacity);
  NewElts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffff;
  puVar5 = std::min<unsigned_long>(puVar5,(unsigned_long *)&NewElts);
  local_58 = *puVar5;
  Dest = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         safe_malloc(local_58 << 5);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (this->
           super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           ).super_SmallVectorBase.BeginX;
  pvVar2 = (this->
           super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           ).super_SmallVectorBase.BeginX;
  local_30 = this;
  local_18 = this;
  local_10 = this;
  sVar4 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorTemplateBase<std::__cxx11::string,false>::
  uninitialized_move<std::__cxx11::string*,std::__cxx11::string*>
            (pbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)pvVar2 + sVar4 * 0x20),Dest);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (this->
           super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           ).super_SmallVectorBase.BeginX;
  pvVar2 = (this->
           super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           ).super_SmallVectorBase.BeginX;
  local_38 = this;
  local_28 = this;
  local_20 = this;
  sVar4 = SmallVectorBase::size((SmallVectorBase *)this);
  destroy_range(pbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)pvVar2 + sVar4 * 0x20));
  bVar3 = SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::isSmall(&this->
                     super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                   );
  if (!bVar3) {
    this_local = this;
    free((this->
         super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         ).super_SmallVectorBase.BeginX);
  }
  (this->
  super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ).super_SmallVectorBase.BeginX = Dest;
  (this->
  super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ).super_SmallVectorBase.Capacity = (uint)local_58;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}